

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNArg::gen_code(CTPNArg *this,int param_1,int param_2)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  CTcGenTarg *pCVar3;
  
  pCVar2 = (this->super_CTPNArgBase).arg_expr_;
  (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,0,0);
  if (((this->super_CTPNArgBase).field_0x40 & 1) != 0) {
    CTcGenTarg::write_op(G_cg,'\x0e');
    pCVar3 = G_cg;
    iVar1 = G_cg->sp_depth_;
    if (G_cg->max_sp_depth_ <= iVar1) {
      G_cg->max_sp_depth_ = iVar1 + 1;
    }
    pCVar3->sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTPNArg::gen_code(int, int)
{
    /* 
     *   Generate the argument expression.  We need the value (hence
     *   discard = false), and we need the assignable value (hence
     *   for_condition = false). 
     */
    get_arg_expr()->gen_code(FALSE, FALSE);

    /* 
     *   if this is a list-to-varargs conversion, generate the conversion
     *   instruction 
     */
    if (is_varargs_)
    {
        /* write the opcode */
        G_cg->write_op(OPC_MAKELSTPAR);

        /* note the extra push and pop for the argument count */
        G_cg->note_push();
        G_cg->note_pop();
    }
}